

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-101.cpp
# Opt level: O3

bool __thiscall
baryonyx::itm::
solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>
::
push_and_compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
          (solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>
           *this,bit_array *x,
          reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *first,reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 *last,float kappa,float delta,float theta,float obj_amp)

{
  int k;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  undefined1 auVar1 [16];
  bool bVar2;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var3;
  rc_size rVar4;
  long lVar5;
  _Head_base<0UL,_int_*,_false> _Var6;
  int iVar7;
  long lVar8;
  int iVar9;
  rc_data *prVar10;
  rc_data *__first;
  bool bVar11;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_60;
  _Head_base<0UL,_int_*,_false> local_58;
  _Head_base<0UL,_int_*,_false> local_50;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *local_48;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false> local_40;
  solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>
  *local_38;
  
  _Var3._M_current = (first->current)._M_current;
  if (_Var3._M_current == (last->current)._M_current) {
    bVar11 = false;
  }
  else {
    local_38 = this + 0x10;
    bVar11 = false;
    local_50._M_head_impl = (int *)first;
    local_48 = last;
    do {
      k = _Var3._M_current[-1];
      sparse_matrix<int>::row((sparse_matrix<int> *)&local_60,(int)local_38);
      if ((tuple<int_*,_std::default_delete<int[]>_>)local_58._M_head_impl !=
          (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
          local_60._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl) {
        lVar5 = *(long *)(this + 0x50);
        _Var6._M_head_impl = local_58._M_head_impl;
        do {
          iVar7 = *_Var6._M_head_impl;
          _Var6._M_head_impl = _Var6._M_head_impl + 8;
          *(float *)(lVar5 + (long)iVar7 * 4) = theta * *(float *)(lVar5 + (long)iVar7 * 4);
        } while ((tuple<int_*,_std::default_delete<int[]>_>)_Var6._M_head_impl !=
                 (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
                 local_60._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl);
      }
      rVar4 = solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
              ::compute_reduced_costs<baryonyx::bit_array>
                        ((solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
                          *)this,(row_iterator)local_58._M_head_impl,
                         (row_iterator)
                         local_60._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                         super__Head_base<0UL,_int_*,_false>._M_head_impl,x);
      __first = *(rc_data **)(this + 0x60);
      iVar7 = rVar4.r_size;
      if (iVar7 != 0) {
        lVar8 = 0;
        lVar5 = *(long *)(*(long *)(this + 0x78) + 8);
        do {
          auVar1 = vfmadd213ss_fma(ZEXT416(*(uint *)(lVar5 + (long)((row_iterator)
                                                                   ((long)local_58._M_head_impl +
                                                                   (long)*(int *)((long)&__first->id
                                                                                 + lVar8) * 8))->
                                                                   column * 4)),
                                   ZEXT416((uint)obj_amp),
                                   ZEXT416(*(uint *)((long)&__first->value + lVar8)));
          *(int *)((long)&__first->value + lVar8) = auVar1._0_4_;
          lVar8 = lVar8 + 0xc;
        } while (((ulong)rVar4 & 0xffffffff) * 0xc != lVar8);
      }
      lVar5 = (long)iVar7;
      if (1 < lVar5) {
        prVar10 = __first + lVar5;
        __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)(this + 8);
        std::
        __introsort_loop<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*>(baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,prVar10,(int)LZCOUNT(lVar5) * 2 ^ 0x7e);
        local_40._M_head_impl = (row_value *)prVar10;
        std::
        __final_insertion_sort<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*>(baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,prVar10);
        lVar5 = lVar5 * 0xc + -0xc;
        prVar10 = __first;
        do {
          prVar10 = prVar10 + 1;
          if ((__first->value != prVar10->value) || (NAN(__first->value) || NAN(prVar10->value))) {
            std::
            shuffle<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (__first,prVar10,__g);
            __first = prVar10;
          }
          lVar5 = lVar5 + -0xc;
        } while (lVar5 != 0);
        std::
        shuffle<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  (__first,(rc_data *)local_40._M_head_impl,__g);
        last = local_48;
        first = (reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 *)local_50;
      }
      iVar9 = rVar4.c_size + *(int *)(*(long *)(this + 0x68) + (long)k * 8);
      if (iVar7 < iVar9) {
        iVar9 = iVar7;
      }
      bVar2 = affect<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,float>
                        ((solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
                          *)this,x,(row_value *)local_58._M_head_impl,k,iVar9 + -1,iVar7,kappa,delta
                        );
      bVar11 = (bool)(bVar11 | bVar2);
      _Var3._M_current = *(int **)first + -1;
      *first = (reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                )_Var3._M_current;
    } while (_Var3._M_current != (last->current)._M_current);
  }
  return bVar11;
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float obj_amp)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto sizes =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            // Before sort and select variables, we apply the push method: for
            // each reduces cost, we had the cost multiply with an objective
            // amplifier.

            for (int i = 0; i != sizes.r_size; ++i)
                R[i].value +=
                  obj_amp * c((std::get<0>(it) + R[i].id)->column, x);

            calculator_sort<Mode>(R.get(), R.get() + sizes.r_size, rng);
            int selected = select_variables(sizes, b[k].value);

            logger::log("constraints {}: {} = ", k, b[k].value);

            for (int i = 0; i < sizes.r_size; ++i)
                logger::log("{} ({}) ", R[i].value, R[i].id);

            logger::log(" => Selected: {}\n", selected);

            auto pi_change = affect(*this,
                                    x,
                                    std::get<0>(it),
                                    k,
                                    selected,
                                    sizes.r_size,
                                    kappa,
                                    delta);
            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }